

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::anon_unknown_0::ReconstructGPrimProperties
               (Specifier *spec,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *properties,GPrim *gprim,string *warn,string *err,
               bool strict_allowedToken_check)

{
  _Base_ptr __v;
  _Base_ptr *rel;
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_type sVar4;
  size_type sVar5;
  bool bVar6;
  undefined1 uVar7;
  int iVar8;
  ostream *poVar9;
  anon_struct_8_0_00000001_for___align *paVar10;
  const_iterator cVar11;
  _Base_ptr p_Var12;
  long *plVar13;
  char *pcVar14;
  uint *args;
  anon_struct_8_0_00000001_for___align prop;
  pointer pPVar15;
  MaterialBinding *mb;
  Collection *coll;
  size_type __n;
  Attribute *attr;
  char *pcVar16;
  _Alloc_hider args_1;
  ParseResult ret;
  string attr_type_name;
  ostringstream ss_e;
  undefined1 local_518 [8];
  undefined1 auStack_510 [8];
  undefined1 local_508 [8];
  undefined1 auStack_500 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  _Alloc_hider local_4e0;
  undefined1 auStack_4d8 [24];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  _Alloc_hider local_480;
  undefined1 local_478 [24];
  _Alloc_hider local_460;
  undefined1 local_458 [24];
  optional<tinyusdz::Path::PathType> local_440;
  AttrMetas *local_438;
  string local_430;
  anon_struct_8_0_00000001_for___align local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  code *local_3e8 [2];
  undefined1 local_3d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Alloc_hider local_358;
  storage_t<tinyusdz::Token> local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [2];
  pointer local_308;
  pointer pPStack_300;
  anon_struct_8_0_00000001_for___align local_2f8;
  ListEditQual local_2f0;
  undefined1 local_2e8 [520];
  bool local_e0;
  RelationshipProperty *local_d8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_d0;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_c8;
  _Base_ptr local_c0;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  bVar6 = ReconstructXformOpsFromProperties
                    (spec,table,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)gprim,err);
  if (bVar6) {
    mb = &gprim->super_MaterialBinding;
    if (gprim == (GPrim *)0x0) {
      mb = (MaterialBinding *)0x0;
    }
    bVar6 = ReconstructMaterialBindingProperties(table,properties,mb,err);
    if (bVar6) {
      coll = &gprim->super_Collection;
      if (gprim == (GPrim *)0x0) {
        coll = (Collection *)0x0;
      }
      args_1._M_p = (pointer)err;
      bVar6 = ReconstructCollectionProperties
                        (table,properties,coll,warn,err,strict_allowedToken_check);
      if (bVar6) {
        p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_c0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
        if (p_Var12 == local_c0) {
          return true;
        }
        local_490._8_8_ = &(table->_M_t)._M_impl.super__Rb_tree_header;
        local_d8 = &gprim->proxyPrim;
        local_440 = (optional<tinyusdz::Path::PathType>)&(gprim->proxyPrim)._relationship.targetPath
        ;
        local_458._16_8_ = local_328 + 2;
        local_458._8_8_ = &(gprim->proxyPrim)._relationship._metas;
        local_458._0_8_ = local_2e8;
        local_460._M_p = (pointer)local_328;
        args = (uint *)&local_348;
        local_490._M_allocated_capacity = (size_type)&local_368;
        local_438 = &(gprim->doubleSided)._metas;
        local_d0 = &(gprim->doubleSided)._paths;
        local_c8 = &gprim->extent;
        local_480._M_p = (pointer)&gprim->orientation;
        local_478._0_8_ = &gprim->purpose;
        local_478._8_8_ = &gprim->visibility;
        auStack_4d8._8_8_ = table;
        auStack_4d8._16_8_ = err;
        local_4b0._20_4_ = (uint)strict_allowedToken_check;
        local_4b0._24_8_ = warn;
        local_478._16_8_ = args;
        while( true ) {
          __v = p_Var12 + 1;
          iVar8 = ::std::__cxx11::string::compare((char *)__v);
          if (iVar8 != 0) goto LAB_001f0ce6;
          local_3e8[0] = (code *)local_3d8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"proxyPrim","");
          cVar11 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_4d8._8_8_,(key_type *)local_3e8);
          if (local_3e8[0] != (code *)local_3d8) {
            operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
          }
          if (cVar11._M_node != (_Base_ptr)local_490._8_8_) goto LAB_001f29ee;
          if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) break;
          if (3 < *(uint *)&p_Var12[0x17]._M_left) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3e8,"ReconstructGPrimProperties",0x1a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((storage_union *)local_3e8,0xabd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            pcVar16 = "Internal error. Property `{}` is not a valid Relationship.";
            pcVar14 = "";
LAB_001f2ddb:
            local_4f0._M_allocated_capacity = (long)auStack_500 + 0x20;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(auStack_500 + 0x10),pcVar16,pcVar14);
            fmt::format<char_const*>
                      ((string *)local_518,(fmt *)(auStack_500 + 0x10),(string *)&kProxyPrim,
                       (char **)args);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_3e8,(char *)local_518,(long)auStack_510);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if (local_518 != (undefined1  [8])local_508) {
              operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
            }
            uVar2 = auStack_4d8._16_8_;
            if ((undefined1 *)local_4f0._M_allocated_capacity != auStack_500 + 0x20) {
              operator_delete((void *)local_4f0._M_allocated_capacity,(ulong)(local_4e0._M_p + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar2 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_518,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (auStack_500 + 0x10),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               uVar2);
              ::std::__cxx11::string::operator=((string *)uVar2,(string *)local_518);
              if (local_518 != (undefined1  [8])local_508) goto LAB_001f2ed9;
              goto LAB_001f2ee6;
            }
            goto LAB_001f2f02;
          }
          rel = &p_Var12[0x17]._M_left;
          args = &switchD_001f1117::switchdataD_003dcf90;
          switch(*(uint *)&p_Var12[0x17]._M_left) {
          case 0:
            RelationshipProperty::RelationshipProperty
                      ((RelationshipProperty *)local_3e8,(Relationship *)rel);
            (gprim->proxyPrim)._authored = (bool)local_3e8[0]._0_1_;
            (gprim->proxyPrim)._relationship.type = local_3e8[1]._0_4_;
            Path::operator=((Path *)local_440,(Path *)local_3d8);
            args = (uint *)local_2f8;
            uVar3 = local_458._16_8_;
            local_508 = (undefined1  [8])
                        (gprim->proxyPrim)._relationship.targetPathVector.
                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            *(anon_struct_8_0_00000001_for___align *)
             &(gprim->proxyPrim)._relationship.targetPathVector.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_2f8;
            local_518 = (undefined1  [8])
                        (gprim->proxyPrim)._relationship.targetPathVector.
                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                        super__Vector_impl_data._M_start;
            auStack_510 = (undefined1  [8])
                          (gprim->proxyPrim)._relationship.targetPathVector.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
            (gprim->proxyPrim)._relationship.targetPathVector.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start = local_308;
            (gprim->proxyPrim)._relationship.targetPathVector.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish = pPStack_300;
            *(size_type *)local_458._16_8_ = 0;
            pcVar14 = (char *)(local_458._16_8_ + 8);
            pcVar14[0] = '\0';
            pcVar14[1] = '\0';
            pcVar14[2] = '\0';
            pcVar14[3] = '\0';
            pcVar14[4] = '\0';
            pcVar14[5] = '\0';
            pcVar14[6] = '\0';
            pcVar14[7] = '\0';
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_458._16_8_ + 0x10))->_M_allocated_capacity = 0;
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_518);
            uVar2 = local_458._0_8_;
            (gprim->proxyPrim)._relationship.listOpQual = local_2f0;
            AttrMetas::operator=((AttrMetas *)local_458._8_8_,(AttrMetas *)local_458._0_8_);
            (gprim->proxyPrim)._relationship._varying_authored = local_e0;
            AttrMetas::~AttrMetas((AttrMetas *)uVar2);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)uVar3);
            if ((pointer)local_348._16_8_ != local_460._M_p) {
              operator_delete((void *)local_348._16_8_,local_328[0]._M_allocated_capacity + 1);
            }
            if (local_358._M_p != (pointer)local_478._16_8_) {
              operator_delete(local_358._M_p,local_348._0_8_ + 1);
            }
            if (local_378._M_p != (pointer)local_490._M_allocated_capacity) {
              operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_p != &local_388) {
              operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_p != &local_3a8) {
              operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._0_8_ != &local_3c8) {
              operator_delete((void *)local_3d8._0_8_,local_3c8._M_allocated_capacity + 1);
            }
            break;
          case 1:
            goto switchD_001f1117_caseD_1;
          case 2:
            if ((long)p_Var12[0x1e]._M_left - (long)p_Var12[0x1e]._M_parent != 0xd0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3e8,"ReconstructGPrimProperties",0x1a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((storage_union *)local_3e8,0xabd);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pcVar16 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
              pcVar14 = "";
              goto LAB_001f2ddb;
            }
            goto switchD_001f1117_caseD_1;
          case 3:
            RelationshipProperty::RelationshipProperty
                      ((RelationshipProperty *)local_3e8,(Relationship *)rel);
            RelationshipProperty::operator=(local_d8,(RelationshipProperty *)local_3e8);
            RelationshipProperty::~RelationshipProperty((RelationshipProperty *)local_3e8);
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)auStack_4d8._8_8_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
LAB_001f0ce6:
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_408,*(long *)(p_Var12 + 1),
                     (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
          prop = (anon_struct_8_0_00000001_for___align)(p_Var12 + 2);
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"doubleSided","");
          sVar5 = local_408._M_string_length;
          sVar4 = local_430._M_string_length;
          auStack_510 = (undefined1  [8])auStack_500;
          local_508 = (undefined1  [8])0x0;
          auStack_500._0_8_ = auStack_500._0_8_ & 0xffffffffffffff00;
          __n = local_408._M_string_length;
          if (local_430._M_string_length < local_408._M_string_length) {
            __n = local_430._M_string_length;
          }
          if (__n == 0) {
            pcVar14 = (char *)args;
            if (local_408._M_string_length == local_430._M_string_length) goto LAB_001f0d9e;
LAB_001f12dd:
            local_518._0_4_ = 1;
          }
          else {
            iVar8 = bcmp(local_408._M_dataplus._M_p,local_430._M_dataplus._M_p,__n);
            pcVar14 = (char *)args;
            if ((sVar5 != sVar4) || (iVar8 != 0)) goto LAB_001f12dd;
LAB_001f0d9e:
            if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              local_518._0_4_ = 7;
              local_4f0._M_allocated_capacity = (size_type)(auStack_500 + 0x20);
              local_4c0._0_8_ = &DAT_0000003e;
              local_4f0._M_allocated_capacity =
                   ::std::__cxx11::string::_M_create((ulong *)(auStack_500 + 0x10),(ulong)local_4c0)
              ;
              local_4e0._M_p = (pointer)local_4c0._0_8_;
              *(undefined8 *)local_4f0._M_allocated_capacity = 0x79747265706f7250;
              *(undefined8 *)(local_4f0._M_allocated_capacity + 8) = 0x756d20607d7b6020;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_4f0._M_allocated_capacity + 0x10))->_M_allocated_capacity =
                   0x7441206562207473;
              builtin_strncpy((char *)(local_4f0._M_allocated_capacity + 0x18),"tribute,",8);
              *(undefined8 *)(local_4f0._M_allocated_capacity + 0x20) = 0x6365642074756220;
              (((string *)(local_4f0._M_allocated_capacity + 0x28))->_M_dataplus)._M_p =
                   (pointer)0x736120646572616c;
              builtin_strncpy((char *)(local_4f0._M_allocated_capacity + 0x2e),"as Relat",8);
              builtin_strncpy((char *)(local_4f0._M_allocated_capacity + 0x36),"ionship.",8);
              local_4f0._8_8_ = local_4c0._0_8_;
              *(char *)(local_4c0._0_8_ + local_4f0._M_allocated_capacity) = '\0';
              pcVar14 = (char *)local_4c0._0_8_;
              fmt::format<std::__cxx11::string>
                        ((string *)local_3e8,(fmt *)(auStack_500 + 0x10),&local_430,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._0_8_);
              ::std::__cxx11::string::operator=((string *)auStack_510,(string *)local_3e8);
              if (local_3e8[0] != (code *)local_3d8) {
                operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
              }
              if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                  (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
                operator_delete((void *)local_4f0._M_allocated_capacity,(ulong)(local_4e0._M_p + 1))
                ;
              }
            }
            Attribute::type_name_abi_cxx11_((string *)(auStack_500 + 0x10),(Attribute *)prop);
            local_3e8[0] = (code *)local_3d8;
            local_3e8[1] = (code *)0x4;
            local_3d8._0_5_ = 0x6c6f6f62;
            if ((storage_t<tinyusdz::Token> *)local_4f0._8_8_ == (storage_t<tinyusdz::Token> *)0x4)
            {
              if (*(int *)local_4f0._M_allocated_capacity != 0x6c6f6f62) {
                local_4c0._0_8_ = local_4b0;
                pcVar14 = (char *)0x6c6f6f62;
                local_4c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x4;
                local_4b0._0_5_ = 0x6c6f6f62;
                if (*(int *)local_4f0._M_allocated_capacity != 0x6c6f6f62) goto LAB_001f0f0d;
              }
              pcVar14 = (char *)0x6c6f6f62;
              if (p_Var12[6]._M_left != p_Var12[6]._M_parent) {
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_d0,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var12[6]._M_parent);
                AttrMetas::operator=(local_438,(AttrMetas *)(p_Var12 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)auStack_4d8._8_8_,&local_408);
                local_518 = (undefined1  [8])((ulong)local_518 & 0xffffffff00000000);
              }
              iVar8 = *(int *)((long)&p_Var12[0x17]._M_parent + 4);
              if (iVar8 == 1) {
                if (p_Var12[3]._M_color == _S_black) {
                  if (p_Var12[5]._M_left == p_Var12[5]._M_parent) {
                    if (p_Var12[4]._M_right == (_Base_ptr)0x0) {
                      bVar6 = false;
                    }
                    else {
                      iVar8 = (**(code **)p_Var12[4]._M_right)();
                      bVar6 = iVar8 == 4;
                    }
                    if ((bVar6) ||
                       (uVar7 = (undefined1)p_Var12[5]._M_color, (uVar7 & _S_black) != _S_red)) {
                      (gprim->doubleSided)._blocked = true;
                      goto LAB_001f155c;
                    }
                  }
                  else {
                    uVar7 = (undefined1)p_Var12[5]._M_color;
                  }
                  if ((((uVar7 & _S_black) == _S_red) && (p_Var12[4]._M_right != (_Base_ptr)0x0)) &&
                     ((iVar8 = (**(code **)p_Var12[4]._M_right)(), iVar8 == 0 ||
                      ((p_Var12[4]._M_right != (_Base_ptr)0x0 &&
                       (iVar8 = (**(code **)p_Var12[4]._M_right)(), iVar8 == 1)))))) {
                    local_518._0_4_ = 4;
                    pcVar16 = 
                    "TimeSample or corrupted value assigned to a property where `uniform` variability is set."
                    ;
                  }
                  else {
                    primvar::PrimVar::get_value<bool>((PrimVar *)local_3e8);
                    if (local_3e8[0]._0_1_ == '\x01') {
                      if ((gprim->doubleSided)._attrib.has_value_ == false) {
                        (gprim->doubleSided)._attrib.has_value_ = true;
                      }
                      (gprim->doubleSided)._attrib.contained = (storage_t<bool>)local_3e8[0]._1_1_;
                      goto LAB_001f155c;
                    }
                    local_518._0_4_ = 8;
                    pcVar16 = "Internal data corrupsed.";
                  }
                  ::std::__cxx11::string::operator=((string *)auStack_510,pcVar16);
                }
                else {
                  local_518._0_4_ = 4;
                  local_4c0._0_8_ = local_4b0;
                  local_410 = (anon_struct_8_0_00000001_for___align)0x2d;
                  local_4c0._0_8_ =
                       ::std::__cxx11::string::_M_create((ulong *)local_4c0,(ulong)&local_410);
                  local_4b0._0_8_ = local_410;
                  *(undefined8 *)local_4c0._0_8_ = 0x7475626972747441;
                  *(undefined8 *)(local_4c0._0_8_ + 8) = 0x6d20607d7b602065;
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_4c0._0_8_ + 0x10))->_M_allocated_capacity = 0x6020656220747375;
                  builtin_strncpy((char *)(local_4c0._0_8_ + 0x18),"uniform`",8);
                  builtin_strncpy((char *)(local_4c0._0_8_ + 0x1d),"rm` vari",8);
                  builtin_strncpy((char *)(local_4c0._0_8_ + 0x25),"ability.",8);
                  local_4c0._8_8_ = local_410;
                  *(char *)(local_4c0._0_8_ + (long)local_410) = '\0';
                  pcVar14 = (char *)local_410;
                  fmt::format<std::__cxx11::string>
                            ((string *)local_3e8,(fmt *)local_4c0,&local_430,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_410);
                  ::std::__cxx11::string::operator=((string *)auStack_510,(string *)local_3e8);
                  if (local_3e8[0] != (code *)local_3d8) {
                    operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                  }
                  if ((storage_t<tinyusdz::Token> *)local_4c0._0_8_ !=
                      (storage_t<tinyusdz::Token> *)local_4b0) {
                    operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0._0_8_ + 1));
                  }
                }
              }
              else if (iVar8 == 0) {
                (gprim->doubleSided)._empty = true;
LAB_001f155c:
                AttrMetas::operator=(local_438,(AttrMetas *)(p_Var12 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)auStack_4d8._8_8_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_430);
                local_518 = (undefined1  [8])((ulong)local_518 & 0xffffffff00000000);
              }
              else {
                args_1._M_p = (pointer)0x25;
                pcVar14 = "Invalid Property type(internal error)";
                ::std::__cxx11::string::_M_replace((ulong)auStack_510,0,(char *)local_508,0x3df078);
                local_518._0_4_ = 8;
              }
            }
            else {
LAB_001f0f0d:
              local_518._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_3e8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d8,"Property type mismatch. ",0x18);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_3d8,local_430._M_dataplus._M_p,
                                  local_430._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," expects type `",0xf);
              local_4c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x4;
              local_4b0._0_5_ = 0x6c6f6f62;
              local_4c0._0_8_ = (storage_t<tinyusdz::Token> *)local_4b0;
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,(char *)local_4b0,4);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"` but defined as type `",0x17);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,(char *)local_4f0._M_allocated_capacity,local_4f0._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`",1);
              if ((storage_t<tinyusdz::Token> *)local_4c0._0_8_ !=
                  (storage_t<tinyusdz::Token> *)local_4b0) {
                operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0._0_8_ + 1));
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)auStack_510,(string *)local_4c0);
              if ((storage_t<tinyusdz::Token> *)local_4c0._0_8_ !=
                  (storage_t<tinyusdz::Token> *)local_4b0) {
                operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0._0_8_ + 1));
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_3e8);
              ::std::ios_base::~ios_base((ios_base *)local_490._M_allocated_capacity);
            }
            if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
              operator_delete((void *)local_4f0._M_allocated_capacity,(ulong)(local_4e0._M_p + 1));
            }
          }
          args = (uint *)pcVar14;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != &local_430.field_2) {
            operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
            args = (uint *)pcVar14;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
          iVar8 = 0;
          if (((ulong)local_518 & 0xfffffffd) == 0) {
            iVar8 = 3;
LAB_001f1618:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_518._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3e8,"ReconstructGPrimProperties",0x1a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((storage_union *)local_3e8,0xabe);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              local_4c0._0_8_ = local_4b0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4c0,"Parsing attribute `{}` failed. Error: {}","");
              args = (uint *)auStack_510;
              fmt::format<char[12],std::__cxx11::string>
                        ((string *)(auStack_500 + 0x10),(fmt *)local_4c0,(string *)"doubleSided",
                         (char (*) [12])args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         args_1._M_p);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_3e8,(char *)local_4f0._M_allocated_capacity,
                                  local_4f0._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                  (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
                operator_delete((void *)local_4f0._M_allocated_capacity,(ulong)(local_4e0._M_p + 1))
                ;
              }
              if ((storage_t<tinyusdz::Token> *)local_4c0._0_8_ !=
                  (storage_t<tinyusdz::Token> *)local_4b0) {
                operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0._0_8_ + 1));
              }
              if ((string *)auStack_4d8._16_8_ != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                paVar10 = (anon_struct_8_0_00000001_for___align *)
                          ::std::__cxx11::string::_M_append(local_4c0,*(ulong *)auStack_4d8._16_8_);
                args = (uint *)(paVar10 + 2);
                if (*paVar10 == (anon_struct_8_0_00000001_for___align)args) {
                  local_4e0._M_p = *(pointer *)args;
                  auStack_4d8._0_8_ = paVar10[3];
                  local_4f0._M_allocated_capacity =
                       (size_type)(storage_t<tinyusdz::Token> *)(auStack_500 + 0x20);
                }
                else {
                  local_4e0._M_p = *(pointer *)args;
                  local_4f0._M_allocated_capacity = (size_type)*paVar10;
                }
                local_4f0._8_8_ = paVar10[1];
                *paVar10 = (anon_struct_8_0_00000001_for___align)args;
                paVar10[1] = (anon_struct_8_0_00000001_for___align)0x0;
                *(undefined1 *)(paVar10 + 2) = 0;
                ::std::__cxx11::string::operator=
                          ((string *)auStack_4d8._16_8_,(string *)(auStack_500 + 0x10));
                if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                    (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
                  operator_delete((void *)local_4f0._M_allocated_capacity,
                                  (ulong)(local_4e0._M_p + 1));
                }
                if ((storage_t<tinyusdz::Token> *)local_4c0._0_8_ !=
                    (storage_t<tinyusdz::Token> *)local_4b0) {
                  operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0._0_8_ + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
              ::std::ios_base::~ios_base((ios_base *)&local_378);
              iVar8 = 1;
              goto LAB_001f1618;
            }
          }
          if (auStack_510 != (undefined1  [8])auStack_500) {
            operator_delete((void *)auStack_510,(ulong)(auStack_500._0_8_ + 1));
          }
          if (bVar6) {
            iVar8 = ::std::__cxx11::string::compare((char *)__v);
            if (iVar8 == 0) {
              local_3e8[0] = (code *)local_3d8;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"visibility","")
              ;
              cVar11 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_4d8._8_8_,(key_type *)local_3e8);
              if (local_3e8[0] != (code *)local_3d8) {
                operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
              }
              if (cVar11._M_node == (_Base_ptr)local_490._8_8_) {
                if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_3e8,(Attribute *)prop);
                  local_518 = (undefined1  [8])local_508;
                  auStack_510 = (undefined1  [8])0x5;
                  local_508._0_6_ = 0x6e656b6f74;
                  if (((local_3e8[1] == (code *)0x5) &&
                      (args._0_4_ = (uint)((byte)*(code *)((long)local_3e8[0] + 4) ^ 0x6e) |
                                    *(uint *)local_3e8[0] ^ 0x656b6f74, args._4_4_ = 0,
                      (uint)args == 0)) &&
                     (uVar1 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar1 < 2)) {
                    if (local_3e8[0] != (code *)local_3d8) {
                      operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                    }
                    if (uVar1 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"ReconstructGPrimProperties",0x1a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"():",3);
                      poVar9 = (ostream *)
                               ::std::ostream::operator<<((storage_union *)local_3e8,0xac0);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"visibility",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"\n",1);
                      uVar2 = local_4b0._24_8_;
                      if ((string *)local_4b0._24_8_ != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_518,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(auStack_500 + 0x10),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)auStack_4d8._16_8_);
                        ::std::__cxx11::string::operator=((string *)uVar2,(string *)local_518);
                        if (local_518 != (undefined1  [8])local_508) {
                          operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
                        }
                        if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                            (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
                          operator_delete((void *)local_4f0._M_allocated_capacity,
                                          (ulong)(local_4e0._M_p + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
                      ::std::ios_base::~ios_base((ios_base *)&local_378);
                      AttrMetas::operator=((AttrMetas *)local_478._8_8_,(AttrMetas *)(p_Var12 + 7));
                      pcVar16 = "visibility";
                      pcVar14 = "";
LAB_001f21a0:
                      local_3e8[0] = (code *)local_3d8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_3e8,pcVar16,pcVar14);
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)auStack_4d8._8_8_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3e8);
                      if (local_3e8[0] != (code *)local_3d8) {
                        operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                      }
                      goto LAB_001f29ee;
                    }
                  }
                  else if (local_3e8[0] != (code *)local_3d8) {
                    operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                  }
                }
                local_3e8[1] = (code *)0x0;
                local_3e8[0] = VisibilityEnumHandler;
                local_3d8._8_8_ =
                     ::std::
                     _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ::_M_invoke;
                local_3d8._0_8_ =
                     ::std::
                     _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ::_M_manager;
                local_518 = (undefined1  [8])local_508;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_518,"visibility","");
                local_48 = (code *)0x0;
                pcStack_40 = (code *)0x0;
                local_58._M_unused._M_object = (void *)0x0;
                local_58._8_8_ = 0;
                if ((code *)local_3d8._0_8_ != (code *)0x0) {
                  (*(code *)local_3d8._0_8_)(&local_58,(storage_union *)local_3e8,2);
                  local_48 = (code *)local_3d8._0_8_;
                  pcStack_40 = (code *)local_3d8._8_8_;
                }
                args_1._M_p = (pointer)local_478._8_8_;
                bVar6 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                  ((string *)local_518,SUB41(local_4b0._20_4_,0),
                                   (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                                   (Attribute *)prop,
                                   (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>
                                    *)local_478._8_8_,(string *)local_4b0._24_8_,
                                   (string *)auStack_4d8._16_8_);
                if (local_48 != (code *)0x0) {
                  (*local_48)(&local_58,&local_58,3);
                }
                if (local_518 != (undefined1  [8])local_508) {
                  operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
                }
                iVar8 = 1;
                if (bVar6) {
                  AttrMetas::operator=((AttrMetas *)local_478._8_8_,(AttrMetas *)(p_Var12 + 7));
                  pcVar16 = "visibility";
                  pcVar14 = "";
                  goto LAB_001f2991;
                }
LAB_001f29c0:
                args = (uint *)prop;
                if ((code *)local_3d8._0_8_ != (code *)0x0) {
                  (*(code *)local_3d8._0_8_)
                            ((storage_union *)local_3e8,(storage_union *)local_3e8,3);
                  args = (uint *)prop;
                }
                goto LAB_001f29df;
              }
            }
            else {
              iVar8 = ::std::__cxx11::string::compare((char *)__v);
              if (iVar8 == 0) {
                local_3e8[0] = (code *)local_3d8;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"purpose","");
                cVar11 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)auStack_4d8._8_8_,(key_type *)local_3e8);
                if (local_3e8[0] != (code *)local_3d8) {
                  operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                }
                if (cVar11._M_node == (_Base_ptr)local_490._8_8_) {
                  if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                    Attribute::type_name_abi_cxx11_((string *)local_3e8,(Attribute *)prop);
                    local_518 = (undefined1  [8])local_508;
                    auStack_510 = (undefined1  [8])0x5;
                    local_508._0_6_ = 0x6e656b6f74;
                    if (((local_3e8[1] == (code *)0x5) &&
                        (args._0_4_ = (uint)((byte)*(code *)((long)local_3e8[0] + 4) ^ 0x6e) |
                                      *(uint *)local_3e8[0] ^ 0x656b6f74, args._4_4_ = 0,
                        (uint)args == 0)) &&
                       (uVar1 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar1 < 2)) {
                      if (local_3e8[0] != (code *)local_3d8) {
                        operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                      }
                      if (uVar1 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"[warn]",6);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"ReconstructGPrimProperties",0x1a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"():",3);
                        poVar9 = (ostream *)
                                 ::std::ostream::operator<<((storage_union *)local_3e8,0xac2);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"No value assigned to `",0x16);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"purpose",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,
                                   "` token attribute. Set default token value.",0x2b);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"\n",1);
                        uVar2 = local_4b0._24_8_;
                        if ((string *)local_4b0._24_8_ != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_518,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(auStack_500 + 0x10),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)auStack_4d8._16_8_);
                          ::std::__cxx11::string::operator=((string *)uVar2,(string *)local_518);
                          if (local_518 != (undefined1  [8])local_508) {
                            operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
                          }
                          if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                              (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
                            operator_delete((void *)local_4f0._M_allocated_capacity,
                                            (ulong)(local_4e0._M_p + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
                        ::std::ios_base::~ios_base((ios_base *)&local_378);
                        AttrMetas::operator=
                                  ((AttrMetas *)local_478._0_8_,(AttrMetas *)(p_Var12 + 7));
                        pcVar16 = "purpose";
                        pcVar14 = "";
                        goto LAB_001f21a0;
                      }
                    }
                    else if (local_3e8[0] != (code *)local_3d8) {
                      operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                    }
                  }
                  local_3e8[1] = (code *)0x0;
                  local_3e8[0] = PurposeEnumHandler;
                  local_3d8._8_8_ =
                       ::std::
                       _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       ::_M_invoke;
                  local_3d8._0_8_ =
                       ::std::
                       _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       ::_M_manager;
                  local_518 = (undefined1  [8])local_508;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_518,"purpose","");
                  local_68 = (code *)0x0;
                  pcStack_60 = (code *)0x0;
                  local_78._M_unused._M_object = (void *)0x0;
                  local_78._8_8_ = 0;
                  if ((code *)local_3d8._0_8_ != (code *)0x0) {
                    (*(code *)local_3d8._0_8_)(&local_78,(storage_union *)local_3e8,2);
                    local_68 = (code *)local_3d8._0_8_;
                    pcStack_60 = (code *)local_3d8._8_8_;
                  }
                  args_1._M_p = (pointer)local_478._0_8_;
                  bVar6 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                    ((string *)local_518,SUB41(local_4b0._20_4_,0),
                                     (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,
                                     (Attribute *)prop,
                                     (TypedAttributeWithFallback<tinyusdz::Purpose> *)
                                     local_478._0_8_,(string *)local_4b0._24_8_,
                                     (string *)auStack_4d8._16_8_);
                  if (local_68 != (code *)0x0) {
                    (*local_68)(&local_78,&local_78,__destroy_functor);
                  }
                  if (local_518 != (undefined1  [8])local_508) {
                    operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
                  }
                  iVar8 = 1;
                  if (!bVar6) goto LAB_001f29c0;
                  AttrMetas::operator=((AttrMetas *)local_478._0_8_,(AttrMetas *)(p_Var12 + 7));
                  pcVar16 = "purpose";
                  pcVar14 = "";
LAB_001f2991:
                  local_518 = (undefined1  [8])local_508;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_518,pcVar16,pcVar14);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)auStack_4d8._8_8_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_518);
                  if (local_518 != (undefined1  [8])local_508) {
                    operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
                  }
                  iVar8 = 3;
                  goto LAB_001f29c0;
                }
              }
              else {
                iVar8 = ::std::__cxx11::string::compare((char *)__v);
                if (iVar8 != 0) {
                  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_b8,*(long *)(p_Var12 + 1),
                             (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
                  args_1._M_p = (pointer)local_3e8;
                  local_3e8[0] = (code *)local_3d8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)args_1._M_p,"extent","");
                  ParseExtentAttribute
                            ((ParseResult *)local_518,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_4d8._8_8_,&local_b8,(Property *)prop,(string *)args_1._M_p,
                             local_c8);
                  if (local_3e8[0] != (code *)local_3d8) {
                    operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  if (((ulong)local_518 & 0xfffffffd) == 0) {
                    iVar8 = 3;
                  }
                  else {
                    iVar8 = 0;
                    if (local_518._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"ReconstructGPrimProperties",0x1a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3e8,"():",3);
                      poVar9 = (ostream *)
                               ::std::ostream::operator<<((storage_union *)local_3e8,0xac5);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                      local_4c0._0_8_ = local_4b0;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_4c0,"Parsing attribute `extent` failed. Error: {}",
                                 "");
                      fmt::format<std::__cxx11::string>
                                ((string *)(auStack_500 + 0x10),(fmt *)local_4c0,
                                 (string *)auStack_510,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)prop);
                      poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_3e8,
                                          (char *)local_4f0._M_allocated_capacity,local_4f0._8_8_);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                          (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
                        operator_delete((void *)local_4f0._M_allocated_capacity,
                                        (ulong)(local_4e0._M_p + 1));
                      }
                      if ((storage_t<tinyusdz::Token> *)local_4c0._0_8_ !=
                          (storage_t<tinyusdz::Token> *)local_4b0) {
                        operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0._0_8_ + 1));
                      }
                      if ((string *)auStack_4d8._16_8_ != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        uVar2 = auStack_4d8._16_8_;
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(auStack_500 + 0x10),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_4c0,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)auStack_4d8._16_8_);
                        ::std::__cxx11::string::operator=
                                  ((string *)uVar2,(string *)(auStack_500 + 0x10));
                        if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                            (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
                          operator_delete((void *)local_4f0._M_allocated_capacity,
                                          (ulong)(local_4e0._M_p + 1));
                        }
                        if ((storage_t<tinyusdz::Token> *)local_4c0._0_8_ !=
                            (storage_t<tinyusdz::Token> *)local_4b0) {
                          operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0._0_8_ + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
                      ::std::ios_base::~ios_base((ios_base *)&local_378);
                      iVar8 = 1;
                    }
                  }
                  args = (uint *)prop;
                  if (auStack_510 != (undefined1  [8])auStack_500) {
                    operator_delete((void *)auStack_510,(ulong)(auStack_500._0_8_ + 1));
                    args = (uint *)prop;
                  }
                  goto LAB_001f29df;
                }
                local_3e8[0] = (code *)local_3d8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3e8,"orientation","");
                cVar11 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)auStack_4d8._8_8_,(key_type *)local_3e8);
                if (local_3e8[0] != (code *)local_3d8) {
                  operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                }
                if (cVar11._M_node == (_Base_ptr)local_490._8_8_) {
                  if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                    Attribute::type_name_abi_cxx11_((string *)local_3e8,(Attribute *)prop);
                    local_518 = (undefined1  [8])local_508;
                    auStack_510 = (undefined1  [8])0x5;
                    local_508._0_6_ = 0x6e656b6f74;
                    if (((local_3e8[1] == (code *)0x5) &&
                        (args._0_4_ = (uint)((byte)*(code *)((long)local_3e8[0] + 4) ^ 0x6e) |
                                      *(uint *)local_3e8[0] ^ 0x656b6f74, args._4_4_ = 0,
                        (uint)args == 0)) &&
                       (uVar1 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar1 < 2)) {
                      if (local_3e8[0] != (code *)local_3d8) {
                        operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                      }
                      if (uVar1 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"[warn]",6);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"ReconstructGPrimProperties",0x1a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"():",3);
                        poVar9 = (ostream *)
                                 ::std::ostream::operator<<((storage_union *)local_3e8,0xac4);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"No value assigned to `",0x16);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"orientation",0xb);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,
                                   "` token attribute. Set default token value.",0x2b);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3e8,"\n",1);
                        uVar2 = local_4b0._24_8_;
                        if ((string *)local_4b0._24_8_ != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_518,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(auStack_500 + 0x10),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)auStack_4d8._16_8_);
                          ::std::__cxx11::string::operator=((string *)uVar2,(string *)local_518);
                          if (local_518 != (undefined1  [8])local_508) {
                            operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
                          }
                          if ((storage_t<tinyusdz::Token> *)local_4f0._M_allocated_capacity !=
                              (storage_t<tinyusdz::Token> *)(auStack_500 + 0x20)) {
                            operator_delete((void *)local_4f0._M_allocated_capacity,
                                            (ulong)(local_4e0._M_p + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
                        ::std::ios_base::~ios_base((ios_base *)&local_378);
                        AttrMetas::operator=((AttrMetas *)local_480._M_p,(AttrMetas *)(p_Var12 + 7))
                        ;
                        pcVar16 = "orientation";
                        pcVar14 = "";
                        goto LAB_001f21a0;
                      }
                    }
                    else if (local_3e8[0] != (code *)local_3d8) {
                      operator_delete(local_3e8[0],(ulong)(local_3d8._0_8_ + 1));
                    }
                  }
                  local_3e8[1] = (code *)0x0;
                  local_3e8[0] = OrientationEnumHandler;
                  local_3d8._8_8_ =
                       ::std::
                       _Function_handler<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       ::_M_invoke;
                  local_3d8._0_8_ =
                       ::std::
                       _Function_handler<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       ::_M_manager;
                  local_518 = (undefined1  [8])local_508;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_518,"orientation","");
                  local_88 = (code *)0x0;
                  pcStack_80 = (code *)0x0;
                  local_98._M_unused._M_object = (void *)0x0;
                  local_98._8_8_ = 0;
                  if ((code *)local_3d8._0_8_ != (code *)0x0) {
                    (*(code *)local_3d8._0_8_)(&local_98,(storage_union *)local_3e8,2);
                    local_88 = (code *)local_3d8._0_8_;
                    pcStack_80 = (code *)local_3d8._8_8_;
                  }
                  args_1._M_p = local_480._M_p;
                  bVar6 = ParseUniformEnumProperty<tinyusdz::Orientation,tinyusdz::Orientation>
                                    ((string *)local_518,SUB41(local_4b0._20_4_,0),
                                     (EnumHandlerFun<tinyusdz::Orientation> *)&local_98,
                                     (Attribute *)prop,
                                     (TypedAttributeWithFallback<tinyusdz::Orientation> *)
                                     local_480._M_p,(string *)local_4b0._24_8_,
                                     (string *)auStack_4d8._16_8_);
                  if (local_88 != (code *)0x0) {
                    (*local_88)(&local_98,&local_98,__destroy_functor);
                  }
                  if (local_518 != (undefined1  [8])local_508) {
                    operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
                  }
                  iVar8 = 1;
                  if (bVar6) {
                    AttrMetas::operator=((AttrMetas *)local_480._M_p,(AttrMetas *)(p_Var12 + 7));
                    pcVar16 = "orientation";
                    pcVar14 = "";
                    goto LAB_001f2991;
                  }
                  goto LAB_001f29c0;
                }
              }
            }
          }
          else {
LAB_001f29df:
            if ((iVar8 != 3) && (iVar8 != 0)) {
              return false;
            }
          }
LAB_001f29ee:
          p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
          if (p_Var12 == local_c0) {
            return true;
          }
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3e8,"ReconstructGPrimProperties",0x1a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<((storage_union *)local_3e8,0xabd);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_4f0._M_allocated_capacity = (size_type)(auStack_500 + 0x20);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(auStack_500 + 0x10),"Property `{}` must be a Relationship.","");
        fmt::format<char_const*>
                  ((string *)local_518,(fmt *)(auStack_500 + 0x10),(string *)&kProxyPrim,
                   (char **)args);
        poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3e8,(char *)local_518,(long)auStack_510);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if (local_518 != (undefined1  [8])local_508) {
          operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
        }
        uVar2 = auStack_4d8._16_8_;
        if ((undefined1 *)local_4f0._M_allocated_capacity != auStack_500 + 0x20) {
          operator_delete((void *)local_4f0._M_allocated_capacity,(ulong)(local_4e0._M_p + 1));
        }
        if ((string *)uVar2 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          plVar13 = (long *)::std::__cxx11::string::_M_append(auStack_500 + 0x10,*(ulong *)uVar2);
          pPVar15 = (pointer)(plVar13 + 2);
          if ((pointer)*plVar13 == pPVar15) {
            local_508 = (undefined1  [8])(pPVar15->_prim_part)._M_dataplus._M_p;
            auStack_500._0_8_ = plVar13[3];
            local_518 = (undefined1  [8])local_508;
          }
          else {
            local_508 = (undefined1  [8])(pPVar15->_prim_part)._M_dataplus._M_p;
            local_518 = (undefined1  [8])*plVar13;
          }
          auStack_510 = (undefined1  [8])plVar13[1];
          *plVar13 = (long)pPVar15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)uVar2,(string *)local_518);
          if (local_518 != (undefined1  [8])local_508) {
LAB_001f2ed9:
            operator_delete((void *)local_518,(ulong)((long)local_508 + 1));
          }
LAB_001f2ee6:
          if ((undefined1 *)local_4f0._M_allocated_capacity != auStack_500 + 0x20) {
            operator_delete((void *)local_4f0._M_allocated_capacity,(ulong)(local_4e0._M_p + 1));
          }
        }
LAB_001f2f02:
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
        ::std::ios_base::~ios_base((ios_base *)&local_378);
      }
    }
  }
  return false;
switchD_001f1117_caseD_1:
  RelationshipProperty::RelationshipProperty((RelationshipProperty *)local_3e8,(Relationship *)rel);
  (gprim->proxyPrim)._authored = (bool)local_3e8[0]._0_1_;
  (gprim->proxyPrim)._relationship.type = local_3e8[1]._0_4_;
  Path::operator=((Path *)local_440,(Path *)local_3d8);
  args = (uint *)local_2f8;
  uVar3 = local_458._16_8_;
  local_508 = (undefined1  [8])
              (gprim->proxyPrim)._relationship.targetPathVector.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  *(anon_struct_8_0_00000001_for___align *)
   &(gprim->proxyPrim)._relationship.targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_2f8;
  local_518 = (undefined1  [8])
              (gprim->proxyPrim)._relationship.targetPathVector.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start;
  auStack_510 = (undefined1  [8])
                (gprim->proxyPrim)._relationship.targetPathVector.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (gprim->proxyPrim)._relationship.targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = local_308;
  (gprim->proxyPrim)._relationship.targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = pPStack_300;
  *(size_type *)local_458._16_8_ = 0;
  pcVar14 = (char *)(local_458._16_8_ + 8);
  pcVar14[0] = '\0';
  pcVar14[1] = '\0';
  pcVar14[2] = '\0';
  pcVar14[3] = '\0';
  pcVar14[4] = '\0';
  pcVar14[5] = '\0';
  pcVar14[6] = '\0';
  pcVar14[7] = '\0';
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)(local_458._16_8_ + 0x10))->_M_allocated_capacity = 0;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_518);
  uVar2 = local_458._0_8_;
  (gprim->proxyPrim)._relationship.listOpQual = local_2f0;
  AttrMetas::operator=((AttrMetas *)local_458._8_8_,(AttrMetas *)local_458._0_8_);
  (gprim->proxyPrim)._relationship._varying_authored = local_e0;
  AttrMetas::~AttrMetas((AttrMetas *)uVar2);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)uVar3);
  if ((pointer)local_348._16_8_ != local_460._M_p) {
    operator_delete((void *)local_348._16_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (local_358._M_p != (pointer)local_478._16_8_) {
    operator_delete(local_358._M_p,local_348._0_8_ + 1);
  }
  if (local_378._M_p != (pointer)local_490._M_allocated_capacity) {
    operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_p != &local_388) {
    operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_p != &local_3a8) {
    operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._0_8_ != &local_3c8) {
    operator_delete((void *)local_3d8._0_8_,local_3c8._M_allocated_capacity + 1);
  }
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)auStack_4d8._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
  goto LAB_001f29ee;
}

Assistant:

bool ReconstructGPrimProperties(
  const Specifier &spec,
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  GPrim *gprim, /* inout */
  std::string *warn,
  std::string *err,
  bool strict_allowedToken_check)
{

  (void)warn;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &gprim->xformOps, err)) {
    return false;
  }

  if (!prim::ReconstructMaterialBindingProperties(table, properties, gprim, err)) {
    return false;
  }

  if (!prim::ReconstructCollectionProperties(
    table, properties, gprim, warn, err, strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kProxyPrim, gprim->proxyPrim)
    PARSE_TYPED_ATTRIBUTE(table, prop, "doubleSided", GPrim, gprim->doubleSided)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, GPrim,
                   gprim->visibility, strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "purpose", Purpose, PurposeEnumHandler, GPrim,
                       gprim->purpose, strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "orientation", Orientation, OrientationEnumHandler, GPrim,
                       gprim->orientation, strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, "extent", GPrim, gprim->extent)
  }

  return true;
}